

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<float_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<float_const&> *this,int *rhs)

{
  ResultBuilder *pRVar1;
  int value;
  uint uVar2;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  Catch *this_00;
  
  uVar2 = -(uint)((float)*rhs == **(float **)(this + 8)) & 1;
  this_00 = (Catch *)(ulong)uVar2;
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,SUB41(uVar2,0));
  Catch::toString_abi_cxx11_(&local_38,this_00,**(float **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)(ulong)(uint)*rhs,value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }